

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O3

int qc_staticlist_get_head(QcStaticList *staticList)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  
  if (staticList == (QcStaticList *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar1 = staticList->head;
    lVar4 = (long)iVar1;
    iVar3 = -99;
    if (lVar4 != -99) {
      lVar2 = staticList->buff_offset;
      iVar3 = *(int *)((long)&staticList->tail + lVar4 * 8 + lVar2);
      staticList->head = iVar3;
      piVar5 = (int *)((long)&staticList->head + (long)iVar3 * 8 + lVar2);
      if ((long)iVar3 == -99) {
        piVar5 = &staticList->tail;
      }
      *piVar5 = -99;
      staticList->num = staticList->num + -1;
      *(undefined8 *)((long)&staticList->head + lVar4 * 8 + lVar2) = 0xffffff9dffffff9d;
      return iVar1;
    }
  }
  return iVar3;
}

Assistant:

int qc_staticlist_get_head(QcStaticList *staticList)
{
    int head;
    _StaticCell *headCell, *secondCell;

    if(NULL == staticList)
        return -1;

    head = staticList->head;
    if(head != QC_INVALID_INT)
    {
        headCell = get_staticlist_cell(staticList, staticList->head);
        staticList->head = headCell->next;
        if(staticList->head == QC_INVALID_INT)
        {
            staticList->tail = QC_INVALID_INT;
        }
        else
        {
            secondCell = get_staticlist_cell(staticList, staticList->head);
            secondCell->previous = QC_INVALID_INT;
        }
        staticList->num --;

        headCell->previous  = QC_INVALID_INT;
        headCell->next = QC_INVALID_INT;
    }

    return head;
}